

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

int Lodtalk::executeScriptFromFileNamed(InterpreterProxy *interpreter,string *filename)

{
  int iVar1;
  string *name;
  StdFile file;
  string basePathString;
  StdFile local_38;
  string local_30;
  
  local_38.file = (FILE *)fopen((filename->_M_dataplus)._M_p,"r");
  if ((FILE *)local_38.file == (FILE *)0x0) {
    nativeErrorFormat("Failed to open file \'%s\'",(filename->_M_dataplus)._M_p);
  }
  dirname((Lodtalk *)&local_30,(char *)filename);
  iVar1 = executeScriptFromFile(interpreter,local_38.file,name,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  StdFile::~StdFile(&local_38);
  return iVar1;
}

Assistant:

int executeScriptFromFileNamed(InterpreterProxy *interpreter, const std::string &filename)
{
	StdFile file(filename, "r");
	if(!file)
		nativeErrorFormat("Failed to open file '%s'", filename.c_str());

	std::string basePathString = dirname(filename);

	return executeScriptFromFile(interpreter, file, filename, basePathString);
}